

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenAddGlobalImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,BinaryenType globalType,bool mutable_)

{
  IString *pIVar1;
  Global *pGVar2;
  tuple<wasm::Global_*,_std::default_delete<wasm::Global>_> tVar3;
  undefined1 reuse;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view sVar4;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> local_38;
  __single_object glob;
  
  reuse = SUB81(externalBaseName,0);
  pIVar1 = (IString *)strlen(internalName);
  sVar4._M_str = (char *)0x0;
  sVar4._M_len = (size_t)internalName;
  sVar4 = wasm::IString::interned(pIVar1,sVar4,(bool)reuse);
  pGVar2 = wasm::Module::getGlobalOrNull(module,(Name)sVar4);
  if (pGVar2 == (Global *)0x0) {
    tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>)operator_new(0x50);
    *(undefined8 *)
     tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = 0;
    *(char **)((long)tVar3.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 8) = (char *)0x0;
    ((string_view *)
    ((long)tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x10))->_M_len = 0;
    *(char **)((long)tVar3.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x18) = (char *)0x0
    ;
    ((string_view *)
    ((long)tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20))->_M_len = 0;
    *(char **)((long)tVar3.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x28) = (char *)0x0
    ;
    ((string_view *)
    ((long)tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x30))->_M_len = 0;
    *(char **)((long)tVar3.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = (char *)0x0
    ;
    ((string_view *)
    ((long)tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40))->_M_len = 0;
    *(char **)((long)tVar3.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) = (char *)0x0
    ;
    local_38._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
         (tuple<wasm::Global_*,_std::default_delete<wasm::Global>_>)
         (tuple<wasm::Global_*,_std::default_delete<wasm::Global>_>)
         tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    pIVar1 = (IString *)strlen(internalName);
    s_01._M_str = (char *)0x0;
    s_01._M_len = (size_t)internalName;
    sVar4 = wasm::IString::interned(pIVar1,s_01,(bool)reuse);
    *(string_view *)
     tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = sVar4;
    pIVar1 = (IString *)strlen(externalModuleName);
    s_02._M_str = (char *)0x0;
    s_02._M_len = (size_t)externalModuleName;
    sVar4 = wasm::IString::interned(pIVar1,s_02,(bool)reuse);
    *(string_view *)
     ((long)tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x18) = sVar4;
    pIVar1 = (IString *)strlen(externalBaseName);
    s_03._M_str = (char *)0x0;
    s_03._M_len = (size_t)externalBaseName;
    sVar4 = wasm::IString::interned(pIVar1,s_03,(bool)reuse);
    *(string_view *)
     ((long)tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x28) = sVar4;
    *(BinaryenType *)
     ((long)tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = globalType;
    *(bool *)((long)tVar3.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                    .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) = mutable_;
    wasm::Module::addGlobal
              (module,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_38);
    if (local_38._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>)0x0) {
      operator_delete((void *)local_38._M_t.
                              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                              .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,0x50);
    }
  }
  else {
    pIVar1 = (IString *)strlen(externalModuleName);
    s._M_str = (char *)0x0;
    s._M_len = (size_t)externalModuleName;
    sVar4 = wasm::IString::interned(pIVar1,s,(bool)reuse);
    (pGVar2->super_Importable).module.super_IString.str = sVar4;
    pIVar1 = (IString *)strlen(externalBaseName);
    s_00._M_str = (char *)0x0;
    s_00._M_len = (size_t)externalBaseName;
    sVar4 = wasm::IString::interned(pIVar1,s_00,(bool)reuse);
    (pGVar2->super_Importable).base.super_IString.str = sVar4;
  }
  return;
}

Assistant:

void BinaryenAddGlobalImport(BinaryenModuleRef module,
                             const char* internalName,
                             const char* externalModuleName,
                             const char* externalBaseName,
                             BinaryenType globalType,
                             bool mutable_) {
  auto* glob = ((Module*)module)->getGlobalOrNull(internalName);
  if (glob == nullptr) {
    auto glob = std::make_unique<Global>();
    glob->name = internalName;
    glob->module = externalModuleName;
    glob->base = externalBaseName;
    glob->type = Type(globalType);
    glob->mutable_ = mutable_;
    ((Module*)module)->addGlobal(std::move(glob));
  } else {
    // already exists so just set module and base
    glob->module = externalModuleName;
    glob->base = externalBaseName;
  }
}